

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O2

void y4m_422jpeg_420jpeg_helper(uchar *_dst,uchar *_src,int _c_w,int _c_h)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uchar uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  
  iVar4 = _c_h + -1;
  iVar6 = 1;
  if (iVar4 < 1) {
    iVar6 = iVar4;
  }
  iVar7 = 2;
  if (iVar4 < 2) {
    iVar7 = iVar4;
  }
  iVar8 = 3;
  if (iVar4 < 3) {
    iVar8 = iVar4;
  }
  lVar14 = (long)_c_w;
  iVar9 = 0;
  if (0 < _c_w) {
    iVar9 = _c_w;
  }
  for (iVar10 = 0; iVar10 != iVar9; iVar10 = iVar10 + 1) {
    if (_c_h < 1) {
      uVar15 = 0;
    }
    else {
      iVar11 = (int)((uint)_src[iVar7 * _c_w] * -0x11 +
                     (uint)_src[iVar6 * _c_w] * 0x4e + (uint)*_src * 0x40 +
                     (uint)_src[iVar8 * _c_w] + (uint)_src[iVar8 * _c_w] * 2 + 0x40) >> 7;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      uVar5 = (uchar)iVar11;
      if (iVar11 < 1) {
        uVar5 = '\0';
      }
      *_dst = uVar5;
      uVar15 = 2;
    }
    lVar1 = uVar15 + 1;
    iVar11 = (int)(uVar15 >> 1) * _c_w;
    lVar16 = (uVar15 - 1) * lVar14;
    lVar17 = (uVar15 - 2) * lVar14;
    lVar2 = uVar15 + 3;
    lVar13 = lVar14 * uVar15;
    lVar3 = uVar15 + 2;
    pbVar12 = _src;
    for (; (long)uVar15 < (long)(_c_h + -3); uVar15 = uVar15 + 2) {
      iVar18 = (int)(((uint)pbVar12[lVar1 * lVar14] + (uint)pbVar12[lVar13]) * 0x4e +
                     ((uint)pbVar12[lVar3 * lVar14] + (uint)pbVar12[lVar16]) * -0x11 +
                     ((uint)pbVar12[lVar2 * lVar14] + (uint)pbVar12[lVar17]) * 3 + 0x40) >> 7;
      if (0xfe < iVar18) {
        iVar18 = 0xff;
      }
      if (iVar18 < 1) {
        iVar18 = 0;
      }
      _dst[iVar11] = (uchar)iVar18;
      pbVar12 = pbVar12 + lVar14 * 2;
      iVar11 = iVar11 + _c_w;
    }
    while ((long)uVar15 < (long)_c_h) {
      iVar18 = (int)(uVar15 + 2);
      iVar11 = iVar4;
      if (iVar18 < iVar4) {
        iVar11 = iVar18;
      }
      iVar18 = (int)uVar15 + 1;
      if (iVar4 <= iVar18) {
        iVar18 = iVar4;
      }
      iVar11 = (int)(((uint)_src[iVar11 * _c_w] + (uint)pbVar12[lVar16]) * -0x11 +
                     ((uint)_src[iVar4 * _c_w] + (uint)pbVar12[lVar17]) * 3 +
                     ((uint)_src[iVar18 * _c_w] + (uint)pbVar12[lVar13]) * 0x4e + 0x40) >> 7;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      _dst[(int)(((uint)(uVar15 >> 1) & 0x7fffffff) * _c_w)] = (uchar)iVar11;
      pbVar12 = pbVar12 + lVar14 * 2;
      uVar15 = uVar15 + 2;
    }
    _src = _src + 1;
    _dst = _dst + 1;
  }
  return;
}

Assistant:

static void y4m_422jpeg_420jpeg_helper(unsigned char *_dst,
                                       const unsigned char *_src, int _c_w,
                                       int _c_h) {
  int y;
  int x;
  /*Filter: [3 -17 78 78 -17 3]/128, derived from a 6-tap Lanczos window.*/
  for (x = 0; x < _c_w; x++) {
    for (y = 0; y < OC_MINI(_c_h, 2); y += 2) {
      _dst[(y >> 1) * _c_w] =
          OC_CLAMPI(0,
                    (64 * _src[0] + 78 * _src[OC_MINI(1, _c_h - 1) * _c_w] -
                     17 * _src[OC_MINI(2, _c_h - 1) * _c_w] +
                     3 * _src[OC_MINI(3, _c_h - 1) * _c_w] + 64) >>
                        7,
                    255);
    }
    for (; y < _c_h - 3; y += 2) {
      _dst[(y >> 1) * _c_w] =
          OC_CLAMPI(0,
                    (3 * (_src[(y - 2) * _c_w] + _src[(y + 3) * _c_w]) -
                     17 * (_src[(y - 1) * _c_w] + _src[(y + 2) * _c_w]) +
                     78 * (_src[y * _c_w] + _src[(y + 1) * _c_w]) + 64) >>
                        7,
                    255);
    }
    for (; y < _c_h; y += 2) {
      _dst[(y >> 1) * _c_w] = OC_CLAMPI(
          0,
          (3 * (_src[(y - 2) * _c_w] + _src[(_c_h - 1) * _c_w]) -
           17 * (_src[(y - 1) * _c_w] + _src[OC_MINI(y + 2, _c_h - 1) * _c_w]) +
           78 * (_src[y * _c_w] + _src[OC_MINI(y + 1, _c_h - 1) * _c_w]) +
           64) >>
              7,
          255);
    }
    _src++;
    _dst++;
  }
}